

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.cpp
# Opt level: O0

void __thiscall Automaton::buildLookaheads(Automaton *this)

{
  bool bVar1;
  Lookback *pLVar2;
  _List_iterator<Item> *in_RDI;
  long in_FS_OFFSET;
  Lookback *lookback;
  ItemPointer c;
  ItemPointer k;
  StatePointer q;
  const_iterator it;
  pair<QMultiMap<std::_List_iterator<Item>,_Lookback>::const_iterator,_QMultiMap<std::_List_iterator<Item>,_Lookback>::const_iterator>
  range;
  ItemPointer item;
  StatePointer p;
  set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *in_stack_ffffffffffffff68;
  set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *in_stack_ffffffffffffff70;
  iterator in_stack_ffffffffffffff80;
  iterator in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffffa0;
  _List_iterator<Item> local_58;
  _Self local_50;
  _List_node_base *local_48;
  const_iterator local_40;
  pair<QMultiMap<std::_List_iterator<Item>,_Lookback>::const_iterator,_QMultiMap<std::_List_iterator<Item>,_Lookback>::const_iterator>
  local_38;
  _Self local_28;
  _Self local_20;
  _Self local_18;
  _Self local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
  local_10._M_node =
       (_List_node_base *)
       std::__cxx11::list<State,_std::allocator<State>_>::begin
                 ((list<State,_std::allocator<State>_> *)in_stack_ffffffffffffff70);
  while( true ) {
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::list<State,_std::allocator<State>_>::end
                   ((list<State,_std::allocator<State>_> *)in_stack_ffffffffffffff70);
    bVar1 = std::operator!=(&local_10,&local_18);
    if (!bVar1) break;
    local_20._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x120168);
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<Item,_std::allocator<Item>_>::begin
                   ((list<Item,_std::allocator<Item>_> *)in_stack_ffffffffffffff70);
    while( true ) {
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x120186);
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::list<Item,_std::allocator<Item>_>::end
                     ((list<Item,_std::allocator<Item>_> *)in_stack_ffffffffffffff70);
      bVar1 = std::operator!=(&local_20,&local_28);
      if (!bVar1) break;
      local_38.second.i._M_node = (const_iterator)(_Base_ptr)0xaaaaaaaaaaaaaaaa;
      local_38.first.i._M_node = (const_iterator)(_Base_ptr)0xaaaaaaaaaaaaaaaa;
      local_38 = QMultiMap<std::_List_iterator<Item>,_Lookback>::equal_range
                           ((QMultiMap<std::_List_iterator<Item>,_Lookback> *)
                            in_stack_ffffffffffffff88._M_node,
                            (_List_iterator<Item> *)in_stack_ffffffffffffff80._M_node);
      local_40 = local_38.first.i._M_node;
      while( true ) {
        bVar1 = ::operator!=((const_iterator *)in_stack_ffffffffffffff70,
                             (const_iterator *)in_stack_ffffffffffffff68);
        if (!bVar1) break;
        pLVar2 = QMultiMap<std::_List_iterator<Item>,_Lookback>::const_iterator::operator*
                           ((const_iterator *)0x12022f);
        local_48 = (pLVar2->state)._M_node;
        in_stack_ffffffffffffff70 =
             QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
             ::operator[]((QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                           *)in_stack_ffffffffffffffa0._M_node,in_RDI);
        std::_List_iterator<State>::operator->((_List_iterator<State> *)0x12026f);
        QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
        ::operator[]((QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                      *)in_stack_ffffffffffffffa0._M_node,(_List_iterator<QString> *)in_RDI);
        in_stack_ffffffffffffff88 =
             std::
             set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
             ::begin(in_stack_ffffffffffffff68);
        std::_List_iterator<State>::operator->((_List_iterator<State> *)0x12029b);
        QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
        ::operator[]((QMap<std::_List_iterator<QString>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                      *)in_stack_ffffffffffffffa0._M_node,(_List_iterator<QString> *)in_RDI);
        in_stack_ffffffffffffff80 =
             std::
             set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
             ::end(in_stack_ffffffffffffff68);
        std::
        set<std::_List_iterator<QString>,std::less<std::_List_iterator<QString>>,std::allocator<std::_List_iterator<QString>>>
        ::insert<std::_Rb_tree_const_iterator<std::_List_iterator<QString>>>
                  (in_stack_ffffffffffffff68,
                   (_Rb_tree_const_iterator<std::_List_iterator<QString>_>)
                   in_stack_ffffffffffffff88._M_node,
                   (_Rb_tree_const_iterator<std::_List_iterator<QString>_>)
                   in_stack_ffffffffffffff80._M_node);
        QMultiMap<std::_List_iterator<Item>,_Lookback>::const_iterator::operator++
                  ((const_iterator *)in_stack_ffffffffffffff70);
      }
      std::_List_iterator<Item>::operator++(&local_20);
    }
    local_50._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x12030a);
    local_50._M_node =
         (_List_node_base *)
         std::__cxx11::list<Item,_std::allocator<Item>_>::begin
                   ((list<Item,_std::allocator<Item>_> *)in_stack_ffffffffffffff70);
    local_58._M_node = (_List_node_base *)0xaaaaaaaaaaaaaaaa;
    std::_List_iterator<State>::operator->((_List_iterator<State> *)0x120330);
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::list<Item,_std::allocator<Item>_>::begin
                   ((list<Item,_std::allocator<Item>_> *)in_stack_ffffffffffffff70);
    while( true ) {
      std::_List_iterator<State>::operator->((_List_iterator<State> *)0x12034e);
      in_stack_ffffffffffffffa0 =
           std::__cxx11::list<Item,_std::allocator<Item>_>::end
                     ((list<Item,_std::allocator<Item>_> *)in_stack_ffffffffffffff70);
      bVar1 = std::operator!=(&local_50,(_Self *)&stack0xffffffffffffffa0);
      if (!bVar1) break;
      in_stack_ffffffffffffff68 =
           QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
           ::operator[]((QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                         *)in_stack_ffffffffffffffa0._M_node,in_RDI);
      QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
      ::operator[]((QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
                    *)in_stack_ffffffffffffffa0._M_node,in_RDI);
      std::
      set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
      ::operator=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      std::_List_iterator<Item>::operator++(&local_50);
      std::_List_iterator<Item>::operator++(&local_58);
    }
    std::_List_iterator<State>::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Automaton::buildLookaheads ()
{
  for (StatePointer p = states.begin (); p != states.end (); ++p)
    {
      for (ItemPointer item = p->closure.begin (); item != p->closure.end (); ++item)
        {
          const auto range = std::as_const(lookbacks).equal_range(item);
          for (auto it = range.first; it != range.second; ++it)
            {
              const Lookback &lookback = *it;
              StatePointer q = lookback.state;

#ifndef QLALR_NO_DEBUG_LOOKAHEADS
              qerr() << "(" << id (p) << ", " << *item->rule << ") lookbacks ";
              dump (qerr(), lookback);
              qerr() << " with follows (" << id (q) << ", " << lookback.nt << ") = " << q->follows [lookback.nt] << Qt::endl;
#endif

              lookaheads [item].insert (q->follows [lookback.nt].begin (), q->follows [lookback.nt].end ());
            }
        }

      // propagate the lookahead in the kernel
      ItemPointer k = p->kernel.begin ();
      ItemPointer c = p->closure.begin ();

      for (; k != p->kernel.end (); ++k, ++c)
        lookaheads [k] = lookaheads [c];
    }
}